

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_handler.cpp
# Opt level: O0

Token * __thiscall TokenReader::peek(Token *__return_storage_ptr__,TokenReader *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  TokenReader *this_local;
  Token *token;
  
  Token::Token(__return_storage_ptr__);
  bVar2 = std::vector<Token,_std::allocator<Token>_>::empty
                    ((vector<Token,_std::allocator<Token>_> *)this);
  if ((!bVar2) &&
     (iVar1 = *(int *)(this + 0x18),
     sVar3 = std::vector<Token,_std::allocator<Token>_>::size
                       ((vector<Token,_std::allocator<Token>_> *)this), (ulong)(long)iVar1 < sVar3))
  {
    pvVar4 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       ((vector<Token,_std::allocator<Token>_> *)this,(long)*(int *)(this + 0x18));
    Token::operator=(__return_storage_ptr__,pvVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Token TokenReader::peek()
{
    Token token;
    if (!m_tokenList.empty() && pos < m_tokenList.size()) {
        token = m_tokenList[pos];
    }
    return token;
}